

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5DlidxLvlNext(Fts5DlidxLvl *pLvl)

{
  Fts5Data *pFVar1;
  u8 *puVar2;
  byte bVar3;
  int iVar4;
  i64 in_RAX;
  long lVar5;
  int iVar6;
  long lVar7;
  i64 iVal;
  
  pFVar1 = pLvl->pData;
  iVar4 = pLvl->iOff;
  lVar7 = (long)iVar4;
  if (lVar7 == 0) {
    pLvl->iOff = 1;
    iVar4 = sqlite3Fts5GetVarint32(pFVar1->p + 1,(u32 *)&pLvl->iLeafPgno);
    lVar7 = (long)iVar4 + (long)pLvl->iOff;
    pLvl->iOff = (int)lVar7;
    bVar3 = sqlite3Fts5GetVarint(pFVar1->p + lVar7,(u64 *)&pLvl->iRowid);
    iVar4 = (uint)bVar3 + pLvl->iOff;
    pLvl->iOff = iVar4;
    pLvl->iFirstOff = iVar4;
  }
  else {
    lVar5 = lVar7 << 0x20;
    iVar6 = 1;
    for (; lVar7 < pFVar1->nn; lVar7 = lVar7 + 1) {
      puVar2 = pFVar1->p;
      if (puVar2[lVar7] != '\0') {
        pLvl->iLeafPgno = pLvl->iLeafPgno + iVar6;
        iVal = in_RAX;
        bVar3 = sqlite3Fts5GetVarint(puVar2 + (lVar5 >> 0x20),(u64 *)&iVal);
        pLvl->iRowid = pLvl->iRowid + iVal;
        pLvl->iOff = (uint)bVar3 + iVar4 + iVar6 + -1;
        goto LAB_001a49cd;
      }
      lVar5 = lVar5 + 0x100000000;
      iVar6 = iVar6 + 1;
    }
    pLvl->bEof = 1;
  }
LAB_001a49cd:
  return pLvl->bEof;
}

Assistant:

static int fts5DlidxLvlNext(Fts5DlidxLvl *pLvl){
  Fts5Data *pData = pLvl->pData;

  if( pLvl->iOff==0 ){
    assert( pLvl->bEof==0 );
    pLvl->iOff = 1;
    pLvl->iOff += fts5GetVarint32(&pData->p[1], pLvl->iLeafPgno);
    pLvl->iOff += fts5GetVarint(&pData->p[pLvl->iOff], (u64*)&pLvl->iRowid);
    pLvl->iFirstOff = pLvl->iOff;
  }else{
    int iOff;
    for(iOff=pLvl->iOff; iOff<pData->nn; iOff++){
      if( pData->p[iOff] ) break; 
    }

    if( iOff<pData->nn ){
      i64 iVal;
      pLvl->iLeafPgno += (iOff - pLvl->iOff) + 1;
      iOff += fts5GetVarint(&pData->p[iOff], (u64*)&iVal);
      pLvl->iRowid += iVal;
      pLvl->iOff = iOff;
    }else{
      pLvl->bEof = 1;
    }
  }

  return pLvl->bEof;
}